

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-double-page-size.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  undefined8 extraout_RAX;
  long *plVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined8 in_RCX;
  int extraout_EDX;
  QPDFPageObjectHelper *page;
  QPDFObjectHandle QVar6;
  QPDF qpdf;
  QPDFWriter w;
  string content;
  QPDF aQStack_b8 [12];
  undefined4 local_ac;
  char *local_a8;
  char *local_a0;
  undefined1 local_98 [32];
  long *local_78 [2];
  long local_68 [2];
  QPDFPageObjectHelper *local_58;
  QPDFPageObjectHelper *local_50;
  undefined1 local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  if ((argc < 2) || (iVar1 = strcmp(argv[1]," --static-id"), iVar1 != 0)) {
    local_ac = 0;
  }
  else {
    argv = argv + 1;
    argc = argc + -1;
    local_ac = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  }
  if (argc - 3U < 2) {
    local_a8 = argv[1];
    local_a0 = argv[2];
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"2 0 0 2 0 0 cm\n","");
    QPDF::QPDF(aQStack_b8);
    QPDF::processFile((char *)aQStack_b8,local_a8);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_98,aQStack_b8);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_98);
    if (local_58 != local_50) {
      page = local_58;
      do {
        QPDF::newStream((string *)local_40);
        QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
        QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)page;
        QPDFPageObjectHelper::addPageContents(QVar6,true);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        doubleBoxSize(page,"/MediaBox");
        doubleBoxSize(page,"/CropBox");
        doubleBoxSize(page,"/BleedBox");
        doubleBoxSize(page,"/TrimBox");
        doubleBoxSize(page,"/ArtBox");
        page = page + 0x38;
      } while (page != local_50);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_58);
    QPDFWriter::QPDFWriter((QPDFWriter *)local_98,aQStack_b8,local_a0);
    if ((char)local_ac != '\0') {
      QPDFWriter::setStaticID(SUB81(local_98,0));
      QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_98);
    }
    QPDFWriter::write();
    pcVar5 = whoami;
    if (whoami == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107090);
    }
    else {
      sVar2 = strlen(whoami);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,": new file written to ",0x16);
    pcVar5 = local_a0;
    if (local_a0 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x107090);
    }
    else {
      sVar2 = strlen(local_a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar2);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
    QPDF::~QPDF(aQStack_b8);
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    return 0;
  }
  usage();
  QPDF::~QPDF(aQStack_b8);
  if (extraout_EDX == 1) {
    plVar3 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar4 = std::operator<<((ostream *)&std::cerr,whoami);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," processing file ",0x11);
    poVar4 = std::operator<<(poVar4,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    pcVar5 = (char *)(**(code **)(*plVar3 + 0x10))(plVar3);
    poVar4 = std::operator<<(poVar4,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(2);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    bool static_id = false;
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (!((argc == 3) || (argc == 4))) {
        usage();
    }

    char const* infilename = argv[1];
    char const* outfilename = argv[2];
    char const* password = (argc == 4) ? argv[3] : "";

    // Text to prepend to each page's contents
    std::string content = "2 0 0 2 0 0 cm\n";

    try {
        QPDF qpdf;
        qpdf.processFile(infilename, password);

        for (auto& page: QPDFPageDocumentHelper(qpdf).getAllPages()) {
            // Prepend the buffer to the page's contents
            page.addPageContents(qpdf.newStream(content), true);

            // Double the size of each of the content boxes
            doubleBoxSize(page, "/MediaBox");
            doubleBoxSize(page, "/CropBox");
            doubleBoxSize(page, "/BleedBox");
            doubleBoxSize(page, "/TrimBox");
            doubleBoxSize(page, "/ArtBox");
        }

        // Write out a new file
        QPDFWriter w(qpdf, outfilename);
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            w.setStaticID(true); // for testing only
            w.setStreamDataMode(qpdf_s_uncompress);
        }
        w.write();
        std::cout << whoami << ": new file written to " << outfilename << std::endl;
    } catch (std::exception& e) {
        std::cerr << whoami << " processing file " << infilename << ": " << e.what() << std::endl;
        exit(2);
    }

    return 0;
}